

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkAttachBottom(Abc_Ntk_t *pNtkTop,Abc_Ntk_t *pNtkBottom)

{
  Abc_Obj_t *pAVar1;
  long *plVar2;
  int iVar3;
  Abc_Obj_t *pNodeTo;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  
  if (pNtkBottom == (Abc_Ntk_t *)0x0) {
    __assert_fail("pNtkBottom != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNtk.c"
                  ,0x330,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkTop != (Abc_Ntk_t *)0x0) {
    iVar3 = pNtkTop->vPis->nSize;
    if (iVar3 != pNtkTop->vCis->nSize) {
      __assert_fail("Abc_NtkPiNum(pNtkTop) == Abc_NtkCiNum(pNtkTop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNtk.c"
                    ,0x334,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    iVar8 = pNtkBottom->vPis->nSize;
    if (iVar8 != pNtkBottom->vCis->nSize) {
      __assert_fail("Abc_NtkPiNum(pNtkBottom) == Abc_NtkCiNum(pNtkBottom)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNtk.c"
                    ,0x335,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (pNtkBottom->vPos->nSize != iVar3) {
      __assert_fail("Abc_NtkPoNum(pNtkBottom) == Abc_NtkPiNum(pNtkTop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNtk.c"
                    ,0x337,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (iVar3 <= iVar8) {
      __assert_fail("Abc_NtkPiNum(pNtkBottom) < Abc_NtkPiNum(pNtkTop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNtk.c"
                    ,0x338,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    pVVar4 = pNtkTop->vPis;
    uVar9 = (ulong)(uint)pVVar4->nSize;
    if (0 < pVVar4->nSize) {
      lVar7 = 0;
      do {
        pAVar1 = (Abc_Obj_t *)pVVar4->pArray[lVar7];
        pNodeTo = Abc_NtkCreateNodeBuf(pNtkTop,(Abc_Obj_t *)0x0);
        Abc_ObjTransferFanout(pAVar1,pNodeTo);
        if (pNtkBottom->vPos->nSize <= lVar7) goto LAB_00817c79;
        *(Abc_Obj_t **)((long)pNtkBottom->vPos->pArray[lVar7] + 0x40) = pNodeTo;
        lVar7 = lVar7 + 1;
        pVVar4 = pNtkTop->vPis;
        uVar9 = (ulong)pVVar4->nSize;
      } while (lVar7 < (long)uVar9);
    }
    iVar3 = pNtkBottom->vPis->nSize;
    if (iVar3 < (int)uVar9) {
      uVar6 = uVar9 & 0xffffffff;
      do {
        uVar6 = uVar6 - 1;
        iVar8 = (int)uVar9;
        if ((iVar8 < 1) || (pNtkTop->vPis->nSize < iVar8)) goto LAB_00817c79;
        Abc_NtkDeleteObj((Abc_Obj_t *)pNtkTop->vPis->pArray[uVar6 & 0xffffffff]);
        iVar3 = pNtkBottom->vPis->nSize;
        uVar9 = (ulong)(iVar8 - 1U);
      } while (iVar3 < (int)(iVar8 - 1U));
    }
    if (iVar3 != pNtkTop->vPis->nSize) {
      __assert_fail("Abc_NtkPiNum(pNtkBottom) == Abc_NtkPiNum(pNtkTop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNtk.c"
                    ,0x343,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    pVVar4 = pNtkBottom->vPis;
    if (0 < pVVar4->nSize) {
      lVar7 = 0;
      do {
        if (pNtkTop->vPis->nSize <= lVar7) {
LAB_00817c79:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        *(void **)((long)pVVar4->pArray[lVar7] + 0x40) = pNtkTop->vPis->pArray[lVar7];
        lVar7 = lVar7 + 1;
        pVVar4 = pNtkBottom->vPis;
      } while (lVar7 < pVVar4->nSize);
    }
    pVVar4 = Abc_NtkDfs(pNtkBottom,0);
    if (0 < pVVar4->nSize) {
      lVar7 = 0;
      do {
        pAVar1 = (Abc_Obj_t *)pVVar4->pArray[lVar7];
        Abc_NtkDupObj(pNtkTop,pAVar1,0);
        if (0 < (pAVar1->vFanins).nSize) {
          lVar5 = 0;
          do {
            Abc_ObjAddFanin((pAVar1->field_6).pCopy,
                            *(Abc_Obj_t **)
                             ((long)pAVar1->pNtk->vObjs->pArray[(pAVar1->vFanins).pArray[lVar5]] +
                             0x40));
            lVar5 = lVar5 + 1;
          } while (lVar5 < (pAVar1->vFanins).nSize);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar4->nSize);
    }
    if (pVVar4->pArray != (void **)0x0) {
      free(pVVar4->pArray);
      pVVar4->pArray = (void **)0x0;
    }
    if (pVVar4 != (Vec_Ptr_t *)0x0) {
      free(pVVar4);
    }
    pVVar4 = pNtkBottom->vPos;
    if (0 < pVVar4->nSize) {
      lVar7 = 0;
      do {
        plVar2 = (long *)pVVar4->pArray[lVar7];
        Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],
                        *(Abc_Obj_t **)
                         (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                   (long)*(int *)plVar2[4] * 8) + 0x40));
        lVar7 = lVar7 + 1;
        pVVar4 = pNtkBottom->vPos;
      } while (lVar7 < pVVar4->nSize);
    }
    Abc_NtkDelete(pNtkBottom);
    iVar3 = Abc_NtkCheck(pNtkTop);
    pNtkBottom = pNtkTop;
    if (iVar3 == 0) {
      fwrite("Abc_NtkAttachBottom(): Network check has failed.\n",0x31,1,_stdout);
    }
  }
  return pNtkBottom;
}

Assistant:

Abc_Ntk_t * Abc_NtkAttachBottom( Abc_Ntk_t * pNtkTop, Abc_Ntk_t * pNtkBottom )
{
    Abc_Obj_t * pObj, * pFanin, * pBuffer;
    Vec_Ptr_t * vNodes;
    int i, k;
    assert( pNtkBottom != NULL );
    if ( pNtkTop == NULL )
        return pNtkBottom;
    // make sure the networks are combinational
    assert( Abc_NtkPiNum(pNtkTop) == Abc_NtkCiNum(pNtkTop) );
    assert( Abc_NtkPiNum(pNtkBottom) == Abc_NtkCiNum(pNtkBottom) );
    // make sure the POs of the bottom correspond to the PIs of the top
    assert( Abc_NtkPoNum(pNtkBottom) == Abc_NtkPiNum(pNtkTop) );
    assert( Abc_NtkPiNum(pNtkBottom) <  Abc_NtkPiNum(pNtkTop) );
    // add buffers for the PIs of the top - save results in the POs of the bottom
    Abc_NtkForEachPi( pNtkTop, pObj, i )
    {
        pBuffer = Abc_NtkCreateNodeBuf( pNtkTop, NULL );
        Abc_ObjTransferFanout( pObj, pBuffer );
        Abc_NtkPo(pNtkBottom, i)->pCopy = pBuffer;
    }
    // remove useless PIs of the top
    for ( i = Abc_NtkPiNum(pNtkTop) - 1; i >= Abc_NtkPiNum(pNtkBottom); i-- )
        Abc_NtkDeleteObj( Abc_NtkPi(pNtkTop, i) );
    assert( Abc_NtkPiNum(pNtkBottom) == Abc_NtkPiNum(pNtkTop) );
    // copy the bottom network
    Abc_NtkForEachPi( pNtkBottom, pObj, i )
        Abc_NtkPi(pNtkBottom, i)->pCopy = Abc_NtkPi(pNtkTop, i);
    // construct all nodes
    vNodes = Abc_NtkDfs( pNtkBottom, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Abc_NtkDupObj(pNtkTop, pObj, 0);
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    }
    Vec_PtrFree( vNodes );
    // connect the POs
    Abc_NtkForEachPo( pNtkBottom, pObj, i )
        Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFanin0(pObj)->pCopy );
    // delete old network
    Abc_NtkDelete( pNtkBottom );
    // return the network
    if ( !Abc_NtkCheck( pNtkTop ) )
        fprintf( stdout, "Abc_NtkAttachBottom(): Network check has failed.\n" );
    return pNtkTop;
}